

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

int vkt::ssbo::anon_unknown_15::getDataTypeByteAlignment(DataType type)

{
  int local_c;
  DataType type_local;
  
  if (type == TYPE_FLOAT) {
LAB_00c5fb8e:
    local_c = 4;
  }
  else {
    if (type == TYPE_FLOAT_VEC2) {
      return 8;
    }
    if (1 < type - TYPE_FLOAT_VEC3) {
      if (type == TYPE_INT) goto LAB_00c5fb8e;
      if (type == TYPE_INT_VEC2) {
        return 8;
      }
      if (1 < type - TYPE_INT_VEC3) {
        if (type == TYPE_UINT) goto LAB_00c5fb8e;
        if (type == TYPE_UINT_VEC2) {
          return 8;
        }
        if (1 < type - TYPE_UINT_VEC3) {
          if (type == TYPE_BOOL) goto LAB_00c5fb8e;
          if (type == TYPE_BOOL_VEC2) {
            return 8;
          }
          if (1 < type - TYPE_BOOL_VEC3) {
            return 0;
          }
        }
      }
    }
    local_c = 0x10;
  }
  return local_c;
}

Assistant:

int getDataTypeByteAlignment (glu::DataType type)
{
	switch (type)
	{
		case glu::TYPE_FLOAT:
		case glu::TYPE_INT:
		case glu::TYPE_UINT:
		case glu::TYPE_BOOL:		return 1*(int)sizeof(deUint32);

		case glu::TYPE_FLOAT_VEC2:
		case glu::TYPE_INT_VEC2:
		case glu::TYPE_UINT_VEC2:
		case glu::TYPE_BOOL_VEC2:	return 2*(int)sizeof(deUint32);

		case glu::TYPE_FLOAT_VEC3:
		case glu::TYPE_INT_VEC3:
		case glu::TYPE_UINT_VEC3:
		case glu::TYPE_BOOL_VEC3:	// Fall-through to vec4

		case glu::TYPE_FLOAT_VEC4:
		case glu::TYPE_INT_VEC4:
		case glu::TYPE_UINT_VEC4:
		case glu::TYPE_BOOL_VEC4:	return 4*(int)sizeof(deUint32);

		default:
			DE_ASSERT(false);
			return 0;
	}
}